

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flags.cc
# Opt level: O0

Flags * __thiscall pstack::Flags::parse(Flags *this,int argc,char **argv)

{
  char **ppcVar1;
  int iVar2;
  char *pcVar3;
  option *poVar4;
  runtime_error *this_00;
  mapped_type *pmVar5;
  allocator<char> local_49;
  string local_48 [32];
  int local_28 [2];
  int c;
  int optidx;
  char **argv_local;
  Flags *pFStack_10;
  int argc_local;
  Flags *this_local;
  
  _c = argv;
  argv_local._4_4_ = argc;
  pFStack_10 = this;
  while( true ) {
    iVar2 = argv_local._4_4_;
    ppcVar1 = _c;
    local_28[1] = 0;
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (this + 0x48));
    poVar4 = std::vector<option,_std::allocator<option>_>::data
                       ((vector<option,_std::allocator<option>_> *)this);
    local_28[0] = getopt_long(iVar2,ppcVar1,pcVar3,poVar4,local_28 + 1);
    if (local_28[0] == -1) {
      return this;
    }
    if (local_28[0] == 0x3f) break;
    pmVar5 = std::
             map<int,_pstack::Flags::Data,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Flags::Data>_>_>
             ::at((map<int,_pstack::Flags::Data,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Flags::Data>_>_>
                   *)(this + 0x18),local_28);
    std::function<void_(const_char_*)>::operator()(&pmVar5->callback,_optarg);
  }
  dump(this,(ostream *)&std::clog);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_48,"unknown command line option ",&local_49);
  std::runtime_error::runtime_error(this_00,local_48);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const Flags &
Flags::parse(int argc, char **argv) const
{
    for (;;) {
       int optidx = 0;
       int c = getopt_long(argc, argv, shortOptions.c_str(), longOptions.data(), &optidx);
       if (c == -1)
          break;

        if (c == '?') {
           dump(std::clog);
           throw std::runtime_error(std::string("unknown command line option "));
        }
        data.at(c).callback(optarg);
    }
    return *this;
}